

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

int __thiscall QSpanData::init(QSpanData *this,EVP_PKEY_CTX *ctx)

{
  QRasterPaintEnginePrivate *in_RDX;
  QClipData *local_28;
  
  this->rasterBuffer = (QRasterBuffer *)ctx;
  *(ushort *)&this->field_0x88 = *(ushort *)&this->field_0x88 & 0xff00;
  *(ushort *)&this->field_0x88 = *(ushort *)&this->field_0x88 & 0xff;
  this->bilinear = false;
  this->m33 = 1.0;
  this->m22 = 1.0;
  this->m11 = 1.0;
  this->dy = 0.0;
  this->dx = 0.0;
  this->m23 = 0.0;
  this->m21 = 0.0;
  this->m13 = 0.0;
  this->m12 = 0.0;
  if (in_RDX == (QRasterPaintEnginePrivate *)0x0) {
    local_28 = (QClipData *)0x0;
  }
  else {
    QRasterPaintEngine::d_func((QRasterPaintEngine *)0x560167);
    local_28 = QRasterPaintEnginePrivate::clip(in_RDX);
  }
  this->clip = local_28;
  return (int)this;
}

Assistant:

void QSpanData::init(QRasterBuffer *rb, const QRasterPaintEngine *pe)
{
    rasterBuffer = rb;
    type = None;
    txop = 0;
    bilinear = false;
    m11 = m22 = m33 = 1.;
    m12 = m13 = m21 = m23 = dx = dy = 0.0;
    clip = pe ? pe->d_func()->clip() : nullptr;
}